

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_func_queue_examples.cpp
# Opt level: O2

void density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::
     func_queue_put_samples(ostream *i_ostream)

{
  uint __line;
  bool bVar1;
  ostream *poVar2;
  value_type *pvVar3;
  undefined8 *puVar4;
  void *pvVar5;
  int iVar6;
  char *__assertion;
  type return_value;
  put_transaction<Func> local_e0;
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  queue;
  double last_val;
  undefined1 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  anon_class_8_1_90f47376 func;
  PrintScopeDuration dur;
  
  PrintScopeDuration::PrintScopeDuration(&dur,i_ostream,"function queue put samples");
  queue.m_queue.m_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  queue.m_queue.m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  queue.m_queue.m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  queue.m_queue.m_mutex.super___mutex_base._M_mutex.__align = 0;
  queue.m_queue.m_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  queue.m_queue.m_queue.m_head = (ControlBlock *)0xffef;
  queue.m_queue.m_queue.m_tail = (ControlBlock *)0xffef;
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
  ::
  emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_1_,density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_1_>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
              *)&queue,(anon_class_1_0_00000001 *)&return_value);
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
  ::
  emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_2_,density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_2_>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
              *)&queue,(anon_class_1_0_00000001 *)&return_value);
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
  ::
  emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_3_,density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_3_>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
              *)&queue,(anon_class_1_0_00000001 *)&return_value);
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
  ::
  emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_4_,density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_4_>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
              *)&queue,(anon_class_1_0_00000001 *)&return_value);
  do {
    bVar1 = density::
            conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
            ::try_consume_impl(&queue);
  } while (bVar1);
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::destroy(&queue.m_queue.m_queue);
  func.last_val = &last_val;
  last_val = 1.0;
  queue.m_queue.m_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  queue.m_queue.m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  queue.m_queue.m_mutex.super___mutex_base._M_mutex.__align = 0;
  queue.m_queue.m_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  queue.m_queue.m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  queue.m_queue.m_queue.m_head = (ControlBlock *)0xffef;
  queue.m_queue.m_queue.m_tail = (ControlBlock *)0xffef;
  iVar6 = 10;
  while (bVar1 = iVar6 != 0, iVar6 = iVar6 + -1, bVar1) {
    density::
    conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,double()>,density::basic_default_allocator<65536ul>>
    ::
    emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_5_,density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_5_&>
              ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,double()>,density::basic_default_allocator<65536ul>>
                *)&queue,&func);
  }
  while( true ) {
    density::
    conc_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
    ::try_consume_impl((conc_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                        *)&return_value,&queue);
    if (return_value.m_has_value == false) break;
    poVar2 = std::ostream::_M_insert<double>((double)return_value.m_storage);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>_>
             *)&queue.m_queue.m_queue);
  queue.m_queue.m_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  queue.m_queue.m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  queue.m_queue.m_mutex.super___mutex_base._M_mutex.__align = 0;
  queue.m_queue.m_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  queue.m_queue.m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  queue.m_queue.m_queue.m_head = (ControlBlock *)0xffef;
  queue.m_queue.m_queue.m_tail = (ControlBlock *)0xffef;
  return_value.m_storage = (type)func_queue_put_samples::Struct::func_1;
  return_value.m_has_value = false;
  return_value._9_7_ = 0;
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
  ::
  emplace<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*)(),int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*)()>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
              *)&queue,(offset_in_Struct_to_subr *)&return_value);
  return_value.m_storage = (type)func_queue_put_samples::Struct::func_2;
  return_value.m_has_value = false;
  return_value._9_7_ = 0;
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
  ::
  emplace<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*)(),int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*)()>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
              *)&queue,(offset_in_Struct_to_subr *)&return_value);
  return_value.m_storage = (type)0x0;
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
  ::
  emplace<int_density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*,int_density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
              *)&queue,(offset_in_Struct_to_int *)&return_value);
  return_value.m_storage = (type)0x4;
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
  ::
  emplace<int_density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*,int_density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
              *)&queue,(offset_in_Struct_to_int *)&return_value);
  return_value.m_storage = (type)0x400000003;
  iVar6 = 0;
  while( true ) {
    density::
    conc_function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
    ::try_consume_impl((conc_function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                        *)&last_val,&queue,&return_value);
    if (last_val._4_1_ == '\0') break;
    iVar6 = iVar6 + last_val._0_4_;
  }
  if (iVar6 == 10) {
    density::
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>_>
    ::destroy((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>_>
               *)&queue.m_queue.m_queue);
    queue.m_queue.m_mutex.super___mutex_base._M_mutex._16_8_ = 0;
    queue.m_queue.m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    queue.m_queue.m_mutex.super___mutex_base._M_mutex.__align = 0;
    queue.m_queue.m_mutex.super___mutex_base._M_mutex._8_8_ = 0;
    queue.m_queue.m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    queue.m_queue.m_queue.m_head = (ControlBlock *)0xffef;
    queue.m_queue.m_queue.m_tail = (ControlBlock *)0xffef;
    return_value.m_storage._0_4_ = 7;
    density::
    conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
    ::
    emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Func,int>
              ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
                *)&queue,(int *)&return_value);
    bVar1 = density::
            conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
            ::try_consume_impl(&queue);
    if (bVar1) {
      density::
      heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
      ::destroy(&queue.m_queue.m_queue);
      queue.m_queue.m_mutex.super___mutex_base._M_mutex._16_8_ = 0;
      queue.m_queue.m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      queue.m_queue.m_mutex.super___mutex_base._M_mutex.__align = 0;
      queue.m_queue.m_mutex.super___mutex_base._M_mutex._8_8_ = 0;
      queue.m_queue.m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      queue.m_queue.m_queue.m_head = (ControlBlock *)0xffef;
      queue.m_queue.m_queue.m_tail = (ControlBlock *)0xffef;
      func.last_val = (double *)0x0;
      density::
      conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
      ::
      start_push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Func>
                ((put_transaction<typename_std::decay<Func>::type> *)&last_val,&queue,
                 (Func_conflict *)&func);
      return_value.m_storage = (type)last_val;
      last_val = 0.0;
      local_88 = '\0';
      local_e0.m_queue =
           (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
            *)local_80;
      local_e0.m_put_data.m_control_block = (ControlBlock *)local_78;
      local_e0.m_put_data.m_user_storage = (void *)uStack_70;
      local_80 = 0;
      density::
      conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
      ::put_transaction<Func>::~put_transaction((put_transaction<Func> *)&last_val);
      pvVar3 = density::
               conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
               ::put_transaction<Func>::raw_allocate_copy<char[12]>
                         ((put_transaction<Func> *)&return_value,(char (*) [12])"Hello world");
      puVar4 = (undefined8 *)
               density::
               heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
               ::put_transaction<Func>::element_ptr(&local_e0);
      *puVar4 = pvVar3;
      pvVar3 = density::
               conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
               ::put_transaction<Func>::raw_allocate_copy<char[18]>
                         ((put_transaction<Func> *)&return_value,
                          (char (*) [18])"\t(I\'m so happy)!!");
      pvVar5 = density::
               heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
               ::put_transaction<Func>::element_ptr(&local_e0);
      *(value_type **)((long)pvVar5 + 8) = pvVar3;
      density::
      conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
      ::put_transaction<Func>::commit((put_transaction<Func> *)&return_value);
      bVar1 = density::
              conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
              ::try_consume_impl(&queue);
      if (!bVar1) {
        __assert_fail("invoked",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                      ,0x9b,
                      "static void density_tests::ConcFunctionQueueSamples<density::function_standard_erasure>::func_queue_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure]"
                     );
      }
      density::
      conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
      ::put_transaction<Func>::~put_transaction((put_transaction<Func> *)&return_value);
      density::
      heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
      ::destroy(&queue.m_queue.m_queue);
      queue.m_queue.m_mutex.super___mutex_base._M_mutex._16_8_ = 0;
      queue.m_queue.m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      queue.m_queue.m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      queue.m_queue.m_mutex.super___mutex_base._M_mutex.__align = 0;
      queue.m_queue.m_mutex.super___mutex_base._M_mutex._8_8_ = 0;
      queue.m_queue.m_queue.m_head = (ControlBlock *)0xffef;
      queue.m_queue.m_queue.m_tail = (ControlBlock *)0xffef;
      density::
      conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
      ::
      start_emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Func>
                ((put_transaction<Func> *)&last_val,&queue);
      return_value.m_storage = (type)last_val;
      return_value.m_has_value = (bool)local_88;
      last_val = 0.0;
      local_88 = '\0';
      local_e0.m_queue =
           (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
            *)local_80;
      local_e0.m_put_data.m_control_block = (ControlBlock *)local_78;
      local_e0.m_put_data.m_user_storage = (void *)uStack_70;
      local_80 = 0;
      density::
      conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
      ::put_transaction<Func>::~put_transaction((put_transaction<Func> *)&last_val);
      pvVar3 = density::
               conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
               ::put_transaction<Func>::raw_allocate_copy<char[12]>
                         ((put_transaction<Func> *)&return_value,(char (*) [12])"Hello world");
      puVar4 = (undefined8 *)
               density::
               heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
               ::put_transaction<Func>::element_ptr(&local_e0);
      *puVar4 = pvVar3;
      pvVar3 = density::
               conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
               ::put_transaction<Func>::raw_allocate_copy<char[18]>
                         ((put_transaction<Func> *)&return_value,
                          (char (*) [18])"\t(I\'m so happy)!!");
      pvVar5 = density::
               heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
               ::put_transaction<Func>::element_ptr(&local_e0);
      *(value_type **)((long)pvVar5 + 8) = pvVar3;
      density::
      conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
      ::put_transaction<Func>::commit((put_transaction<Func> *)&return_value);
      bVar1 = density::
              conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
              ::try_consume_impl(&queue);
      if (bVar1) {
        density::
        conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        ::put_transaction<Func>::~put_transaction((put_transaction<Func> *)&return_value);
        density::
        heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        ::destroy(&queue.m_queue.m_queue);
        PrintScopeDuration::~PrintScopeDuration(&dur);
        return;
      }
      __assert_fail("invoked",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                    ,0xb8,
                    "static void density_tests::ConcFunctionQueueSamples<density::function_standard_erasure>::func_queue_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure]"
                   );
    }
    __assertion = "invoked";
    __line = 0x7e;
  }
  else {
    __assertion = "sum == 10";
    __line = 0x5c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                ,__line,
                "static void density_tests::ConcFunctionQueueSamples<density::function_standard_erasure>::func_queue_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure]"
               );
}

Assistant:

static void func_queue_put_samples(std::ostream & i_ostream)
        {
            PrintScopeDuration dur(i_ostream, "function queue put samples");

            using namespace density;

            {
                //! [conc_function_queue push example 1]
                conc_function_queue<void(), default_allocator, ERASURE> queue;
                queue.push([] { std::cout << "Hello"; });
                queue.push([] { std::cout << " world"; });
                queue.push([] { std::cout << "!!!"; });
                queue.push([] { std::cout << std::endl; });
                while (queue.try_consume())
                    ;
                //! [conc_function_queue push example 1]
            }
            {
                //! [conc_function_queue push example 2]
                double last_val = 1.;

                auto func = [&last_val] { return last_val /= 2.; };

                conc_function_queue<double(), default_allocator, ERASURE> queue;
                for (int i = 0; i < 10; i++)
                    queue.push(func);

                while (auto const return_value = queue.try_consume())
                    std::cout << *return_value << std::endl;
                //! [conc_function_queue push example 2]
            }
            {
                //! [conc_function_queue push example 3]
#if !defined(_MSC_VER) || !defined(_M_X64) /* the size of a type must always be a multiple of
        the alignment, but in the Microsoft's compiler, on 64-bit targets, pointers to data
        member are 4 bytes big, but are aligned to 8 bytes.

        Test code:
            using T = int Struct::*;
            std::cout << sizeof(T) << std::endl;
            std::cout << alignof(T) << std::endl;
        */

                struct Struct
                {
                    int func_1() { return 1; }
                    int func_2() { return 2; }
                    int var_1 = 3;
                    int var_2 = 4;
                };

                conc_function_queue<int(Struct *)> queue;
                queue.push(&Struct::func_1);
                queue.push(&Struct::func_2);
                queue.push(&Struct::var_1);
                queue.push(&Struct::var_2);

                Struct struct_instance;

                int sum = 0;
                while (auto const return_value = queue.try_consume(&struct_instance))
                    sum += *return_value;
                assert(sum == 10);

#endif
//! [conc_function_queue push example 3]
#if !defined(_MSC_VER) || !defined(_M_X64)
                (void)sum;
#endif
            }
            {
                //! [conc_function_queue emplace example 1]
                /* This local struct is unmovable and uncopyable, so emplace is the only
                    option to add it to the queue. Note that operator () returns an int,
                    but we add it to a void() function queue. This is ok, as we are just
                    discarding the return value. */
                struct Func
                {
                    int const m_value;

                    Func(int i_value) : m_value(i_value) {}

                    Func(const Func &) = delete;
                    Func & operator=(const Func &) = delete;

                    int operator()() const
                    {
                        std::cout << m_value << std::endl;
                        return m_value;
                    }
                };

                conc_function_queue<void(), default_allocator, ERASURE> queue;
                queue.template emplace<Func>(7);

                bool const invoked = queue.try_consume();
                assert(invoked);
                //! [conc_function_queue emplace example 1]
                (void)invoked;
            }
            {
                //! [conc_function_queue start_push example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                conc_function_queue<void(), default_allocator, ERASURE> queue;
                auto transaction = queue.start_push(Func{});

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                bool const invoked = queue.try_consume();
                assert(invoked);
                //! [conc_function_queue start_push example 1]
                (void)invoked;
            }
            {
                //! [conc_function_queue start_emplace example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                conc_function_queue<void(), default_allocator, ERASURE> queue;
                auto transaction = queue.template start_emplace<Func>();

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                bool const invoked = queue.try_consume();
                assert(invoked);
                //! [conc_function_queue start_emplace example 1]
                (void)invoked;
            }
        }